

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * Catch::Matchers::Generic::Detail::finalizeDescription
                   (string *__return_storage_ptr__,string *desc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (desc->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"matches undescribed predicate",
               (allocator<char> *)&local_30);
  }
  else {
    std::operator+(&local_30,"matches predicate: \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)desc);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30,
                   '\"');
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Catch::Matchers::Generic::Detail::finalizeDescription(const std::string& desc) {
    if (desc.empty()) {
        return "matches undescribed predicate";
    } else {
        return "matches predicate: \"" + desc + '"';
    }
}